

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_expression.cpp
# Opt level: O1

void __thiscall duckdb::ConstantExpression::ConstantExpression(ConstantExpression *this)

{
  LogicalType local_30;
  
  (this->super_ParsedExpression).super_BaseExpression.type = VALUE_CONSTANT;
  (this->super_ParsedExpression).super_BaseExpression.expression_class = CONSTANT;
  (this->super_ParsedExpression).super_BaseExpression.alias._M_dataplus._M_p =
       (pointer)&(this->super_ParsedExpression).super_BaseExpression.alias.field_2;
  (this->super_ParsedExpression).super_BaseExpression.alias._M_string_length = 0;
  (this->super_ParsedExpression).super_BaseExpression.alias.field_2._M_local_buf[0] = '\0';
  (this->super_ParsedExpression).super_BaseExpression.query_location.index = 0xffffffffffffffff;
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)&PTR__ConstantExpression_019b0090;
  LogicalType::LogicalType(&local_30,SQLNULL);
  Value::Value(&this->value,&local_30);
  LogicalType::~LogicalType(&local_30);
  return;
}

Assistant:

ConstantExpression::ConstantExpression() : ParsedExpression(ExpressionType::VALUE_CONSTANT, ExpressionClass::CONSTANT) {
}